

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

lightlist_t * P_GetPlaneLight(sector_t *sector,secplane_t *plane,bool underside)

{
  uint uVar1;
  TArray<lightlist_t,_lightlist_t> *this;
  lightlist_t *plVar2;
  double dVar3;
  double local_38;
  double planeheight;
  TArray<lightlist_t,_lightlist_t> *lightlist;
  uint i;
  bool underside_local;
  secplane_t *plane_local;
  sector_t *sector_local;
  
  this = &(sector->e->XFloor).lightlist;
  local_38 = secplane_t::ZatPoint(plane,&sector->centerspot);
  if (underside) {
    local_38 = local_38 - 1.52587890625e-05;
  }
  lightlist._0_4_ = 1;
  while( true ) {
    uVar1 = TArray<lightlist_t,_lightlist_t>::Size(this);
    if (uVar1 <= (uint)lightlist) {
      uVar1 = TArray<lightlist_t,_lightlist_t>::Size(this);
      plVar2 = TArray<lightlist_t,_lightlist_t>::operator[](this,(ulong)(uVar1 - 1));
      return plVar2;
    }
    plVar2 = TArray<lightlist_t,_lightlist_t>::operator[](this,(ulong)(uint)lightlist);
    dVar3 = secplane_t::ZatPoint(&plVar2->plane,&sector->centerspot);
    if (dVar3 <= local_38) break;
    lightlist._0_4_ = (uint)lightlist + 1;
  }
  plVar2 = TArray<lightlist_t,_lightlist_t>::operator[](this,(ulong)((uint)lightlist - 1));
  return plVar2;
}

Assistant:

lightlist_t * P_GetPlaneLight(sector_t * sector, secplane_t * plane, bool underside)
{
	unsigned   i;
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	double planeheight=plane->ZatPoint(sector->centerspot);
	if(underside) planeheight-= EQUAL_EPSILON;
	
	for(i = 1; i < lightlist.Size(); i++)
		if (lightlist[i].plane.ZatPoint(sector->centerspot) <= planeheight) 
			return &lightlist[i - 1];
		
	return &lightlist[lightlist.Size() - 1];
}